

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O1

void __thiscall
converterApp_fileConversions_Test::~converterApp_fileConversions_Test
          (converterApp_fileConversions_Test *this)

{
  pointer *this_00;
  
  this_00 = &this[-1].super_converterApp.unit_conv.
             super__Vector_base<convValue,_std::allocator<convValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this[-1].super_converterApp.unit_conv.super__Vector_base<convValue,_std::allocator<convValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__converterApp_0019d848;
  (this->super_converterApp).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&DAT_0019d888;
  std::vector<convValue,_std::allocator<convValue>_>::~vector
            ((vector<convValue,_std::allocator<convValue>_> *)
             &(this->super_converterApp).
              super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super_Test.gtest_flag_saver_);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x30);
  return;
}

Assistant:

TEST_P(converterApp, fileConversions)
{
    std::string testFile = TEST_FILE_FOLDER "/test_conversions/";
    testFile.append(GetParam());
    testFile.append("_conversions.txt");
    loadFile(testFile);
    auto baseUnit = units::unit_from_string(unit_conv[0].name);
    double baseValue = unit_conv[0].value;
    for (auto& convcode : unit_conv) {
        auto unit = units::unit_from_string(convcode.name);
        EXPECT_FALSE(is_error(unit)) << "error converting " << convcode.name;
        if (!convcode.short_name.empty()) {
            auto unit_short = units::unit_from_string(convcode.short_name);
            EXPECT_FALSE(is_error(unit_short))
                << "error converting " << convcode.short_name;
            if (unit != unit_short) {
                if (unit == units::precise::log::bel) {
                    continue;  // this is a known choice to match SI
                }
                EXPECT_FLOAT_EQ(convert(1.0, unit, unit_short), 1.0F)
                    << convcode.short_name << " and " << convcode.name
                    << " do not match";
            } else {
                EXPECT_EQ(unit, unit_short)
                    << convcode.name << " and " << convcode.short_name
                    << " do not produce the same unit";
            }
        }
        double res = units::convert(baseValue, baseUnit, unit);
        EXPECT_NEAR(res / convcode.value, 1.0, 0.003)
            << unit_conv[0].name << " to " << convcode.name << " produced "
            << res << " when " << convcode.value << " expected";
        double return_value = units::convert(convcode.value, unit, baseUnit);
        EXPECT_NEAR(return_value / baseValue, 1.0, 0.003);
    }
}